

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O3

WJTL_STATUS VerifyJsonParsesAsDictionaryOfStrings(_Bool IsJson5,char *Json,size_t NumItems)

{
  WJTL_STATUS WVar1;
  JL_DATA_TYPE JVar2;
  JL_STATUS JVar3;
  int iVar4;
  WJTL_STATUS WVar5;
  uint uVar6;
  size_t sVar7;
  bool Condition;
  JlDataObject *dictionaryObject;
  char *stringPtr;
  JlDataObject *object;
  char valueStr [16];
  char itemName [16];
  size_t errorAtPos;
  JlDataObject *local_78;
  size_t local_70;
  char *local_68;
  JlDataObject *local_60;
  char local_58 [32];
  size_t local_38;
  
  local_78 = (JlDataObject *)0x0;
  local_38 = 100;
  local_70 = NumItems;
  WVar1 = JlParseJsonEx(Json,IsJson5,&local_78,&local_38);
  Condition = WVar1 == WJTL_STATUS_SUCCESS;
  if (!Condition) {
    WVar1 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(Condition,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &dictionaryObject, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsDictionaryOfStrings",0x3a2);
  if (local_78 != (JlDataObject *)0x0) {
    JVar2 = JlGetObjectType(local_78);
    WVar5 = WJTL_STATUS_FAILED;
    if (JVar2 == JL_DATA_TYPE_DICTIONARY) {
      WVar5 = WVar1;
    }
    WjTestLib_Assert(JVar2 == JL_DATA_TYPE_DICTIONARY,
                     "JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsDictionaryOfStrings",0x3a5);
    JVar2 = JlGetObjectType(local_78);
    if (local_70 != 0 && JVar2 == JL_DATA_TYPE_DICTIONARY) {
      sVar7 = 0;
      do {
        local_60 = (JlDataObject *)0x0;
        local_68 = (char *)0x0;
        local_58[0x10] = '\0';
        local_58[0x11] = '\0';
        local_58[0x12] = '\0';
        local_58[0x13] = '\0';
        local_58[0x14] = '\0';
        local_58[0x15] = '\0';
        local_58[0x16] = '\0';
        local_58[0x17] = '\0';
        local_58[0x18] = '\0';
        local_58[0x19] = '\0';
        local_58[0x1a] = '\0';
        local_58[0x1b] = '\0';
        local_58[0x1c] = '\0';
        local_58[0x1d] = '\0';
        local_58[0x1e] = '\0';
        local_58[0x1f] = '\0';
        uVar6 = (int)sVar7 + 1;
        sprintf(local_58 + 0x10,"item%u",(ulong)uVar6);
        local_58[0] = '\0';
        local_58[1] = '\0';
        local_58[2] = '\0';
        local_58[3] = '\0';
        local_58[4] = '\0';
        local_58[5] = '\0';
        local_58[6] = '\0';
        local_58[7] = '\0';
        local_58[8] = '\0';
        local_58[9] = '\0';
        local_58[10] = '\0';
        local_58[0xb] = '\0';
        local_58[0xc] = '\0';
        local_58[0xd] = '\0';
        local_58[0xe] = '\0';
        local_58[0xf] = '\0';
        sprintf(local_58,"%u",(ulong)uVar6);
        JVar3 = JlGetObjectFromDictionaryByKey(local_78,local_58 + 0x10,&local_60);
        if (JVar3 != JL_STATUS_SUCCESS) {
          WVar5 = WJTL_STATUS_FAILED;
        }
        WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                         "((JL_STATUS)(JlGetObjectFromDictionaryByKey( dictionaryObject, itemName, &object ))) == (JL_STATUS_SUCCESS)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                         ,"VerifyJsonParsesAsDictionaryOfStrings",0x3b1);
        if (local_60 != (JlDataObject *)0x0) {
          JVar3 = JlGetObjectString(local_60,&local_68);
          WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                           "((JL_STATUS)(JlGetObjectString( object, &stringPtr ))) == (JL_STATUS_SUCCESS)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                           ,"VerifyJsonParsesAsDictionaryOfStrings",0x3b4);
          iVar4 = strcmp(local_68,local_58);
          WjTestLib_Assert(iVar4 == 0,"strcmp( stringPtr, valueStr ) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                           ,"VerifyJsonParsesAsDictionaryOfStrings",0x3b5);
          if (iVar4 != 0 || JVar3 != JL_STATUS_SUCCESS) {
            WVar5 = WJTL_STATUS_FAILED;
          }
        }
        sVar7 = sVar7 + 1;
      } while (local_70 != sVar7);
    }
    JVar3 = JlFreeObjectTree(&local_78);
    WVar1 = WJTL_STATUS_FAILED;
    if (JVar3 == JL_STATUS_SUCCESS) {
      WVar1 = WVar5;
    }
    WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlFreeObjectTree( &dictionaryObject ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsDictionaryOfStrings",0x3bb);
  }
  return WVar1;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsDictionaryOfStrings
    (
        bool            IsJson5,
        char const*     Json,
        size_t          NumItems
    )
{
    JlDataObject*   dictionaryObject = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &dictionaryObject, &errorAtPos ) );
    if( NULL != dictionaryObject )
    {
        JL_ASSERT( JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY );
        if( JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY )
        {
            for( size_t num=1; num<=NumItems; num++ )
            {
                JlDataObject* object = NULL;
                char const* stringPtr = NULL;
                char itemName [16] = {0};
                sprintf( itemName, "item%u", (uint32_t)num );
                char valueStr [16] = {0};
                sprintf( valueStr, "%u", (uint32_t)num );

                JL_ASSERT_SUCCESS( JlGetObjectFromDictionaryByKey( dictionaryObject, itemName, &object ) );
                if( NULL != object )
                {
                    JL_ASSERT_SUCCESS( JlGetObjectString( object, &stringPtr ) );
                    JL_ASSERT( strcmp( stringPtr, valueStr ) == 0 );
                }
            }
        }

        // Clean up
        JL_ASSERT_SUCCESS( JlFreeObjectTree( &dictionaryObject ) );
    }

    return TestReturn;
}